

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_type sVar4;
  Expression *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pDVar9;
  bool bVar10;
  undefined7 uVar11;
  pointer pDVar12;
  pointer pDVar13;
  long lVar14;
  long lVar15;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar3 = this->cap;
  if (capacity < uVar3 * 2) {
    capacity = uVar3 * 2;
  }
  if (0x7fffffffffffffff - uVar3 < uVar3) {
    capacity = 0x7fffffffffffffff;
  }
  lVar15 = (long)pos - (long)this->data_;
  pDVar12 = (pointer)detail::allocArray(capacity,0x20);
  pEVar5 = args->value;
  uVar6 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar7 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar12 + lVar15 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar7;
  *(undefined8 *)((long)pDVar12 + lVar15) = pEVar5;
  ((undefined8 *)((long)pDVar12 + lVar15))[1] = uVar6;
  pDVar13 = this->data_;
  sVar4 = this->len;
  pDVar9 = pDVar12;
  if (pDVar13 + sVar4 == pos) {
    if (sVar4 != 0) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pDVar13->value + lVar14);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&(pDVar13->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar14 + 8);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pDVar12->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar14 + 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&pDVar12->value + lVar14);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        lVar14 = lVar14 + 0x20;
      } while (sVar4 * 0x20 != lVar14);
    }
  }
  else {
    for (; pDVar13 != pos; pDVar13 = pDVar13 + 1) {
      pEVar5 = pDVar13->value;
      uVar6 = *(undefined8 *)
               &(pDVar13->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar10 = (pDVar13->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar11 = *(undefined7 *)
                &(pDVar13->weight).
                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload
                 .super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar13->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar10;
      *(undefined7 *)
       &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar11;
      pDVar9->value = pEVar5;
      *(undefined8 *)
       &(pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar6;
      pDVar9 = pDVar9 + 1;
    }
    sVar4 = this->len;
    pDVar13 = this->data_;
    if (pDVar13 + sVar4 != pos) {
      puVar1 = (undefined8 *)((long)pDVar12 + lVar15);
      do {
        pEVar5 = pos->value;
        uVar6 = *(undefined8 *)
                 &(pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload;
        uVar7 = *(undefined8 *)
                 &(pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_engaged;
        puVar1[6] = (pos->weight).
                    super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                    _M_payload._M_value.expr;
        puVar1[7] = uVar7;
        puVar1[4] = pEVar5;
        puVar1[5] = uVar6;
        pos = pos + 1;
        puVar1 = puVar1 + 4;
      } while (pos != pDVar13 + sVar4);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pDVar12;
  return (pointer)((long)pDVar12 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}